

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O3

int cuddExact(DdManager *table,int lower,int upper)

{
  DdHalfWord DVar1;
  uint uVar2;
  DdSubtable *pDVar3;
  DdHalfWord *pDVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  DdHalfWord tmp;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar13;
  DdHalfWord **matrix;
  uint *__ptr;
  void *__ptr_00;
  int iVar14;
  uint uVar15;
  int iVar16;
  DdHalfWord DVar17;
  long lVar18;
  DdHalfWord *pDVar19;
  int iVar20;
  ulong uVar21;
  uint cols;
  uint uVar22;
  ulong uVar23;
  uint *puVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  DdHalfWord **ppDVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  int upper_00;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  int size;
  uint *local_168;
  int local_158;
  uint local_154;
  DdHalfWord **local_150;
  DdHalfWord *local_148;
  uint *local_140;
  DdHalfWord *local_138;
  ulong local_100;
  long local_b0;
  long local_a8;
  ulong uVar12;
  
  uVar21 = (ulong)(uint)upper;
  uVar37 = (ulong)(uint)lower;
  pDVar3 = table->subtables;
  uVar39 = (ulong)lower;
  if (pDVar3[uVar39].keys == 1) {
    puVar13 = &pDVar3[uVar39 + 1].keys;
    do {
      if (((long)upper <= (long)uVar39) || (table->vars[table->invperm[uVar39]]->ref != 1)) break;
      uVar39 = uVar39 + 1;
      uVar36 = *puVar13;
      puVar13 = puVar13 + 0xe;
    } while (uVar36 == 1);
    uVar37 = uVar39 & 0xffffffff;
  }
  uVar38 = (ulong)upper;
  uVar36 = (uint)uVar37;
  if (pDVar3[uVar38].keys == 1) {
    puVar13 = &pDVar3[uVar38 - 1].keys;
    do {
      if (((long)uVar38 <= (long)(int)uVar36) || (table->vars[table->invperm[uVar38]]->ref != 1))
      break;
      uVar38 = uVar38 - 1;
      uVar9 = *puVar13;
      puVar13 = puVar13 + -0xe;
    } while (uVar9 == 1);
    uVar21 = uVar38 & 0xffffffff;
  }
  upper_00 = (int)uVar21;
  iVar14 = uVar36 - upper_00;
  if (iVar14 == 0) {
    return 1;
  }
  iVar8 = cuddSymmSiftingConv(table,uVar36,upper_00);
  if (iVar8 == 0) goto LAB_00782a88;
  uVar9 = upper_00 - uVar36;
  uVar12 = (ulong)uVar9;
  cols = uVar9 + 1;
  iVar8 = 0;
  if ((int)(uVar36 + 1) < upper_00) {
    lVar18 = (long)(int)(uVar36 + 1);
    puVar13 = &table->subtables[lVar18].keys;
    iVar34 = ~uVar36 + upper_00;
    iVar8 = 0;
    do {
      if (*puVar13 == 1) {
        iVar8 = iVar8 + (uint)(table->vars[table->invperm[lVar18]]->ref == 1);
      }
      lVar18 = lVar18 + 1;
      puVar13 = puVar13 + 0xe;
      iVar34 = iVar34 + -1;
    } while (iVar34 != 0);
  }
  uVar15 = cols - iVar8;
  if (0x21 < uVar15) goto LAB_00782a88;
  iVar8 = table->size;
  iVar34 = 1;
  if (1 < uVar15) {
    uVar10 = uVar15 + 3 >> 1;
    dVar40 = (double)uVar10;
    dVar41 = (double)(int)(uVar10 + 1);
    if (dVar41 <= (double)(int)uVar15) {
      dVar42 = 2.0;
      do {
        dVar40 = (dVar40 * dVar41) / dVar42;
        dVar41 = dVar41 + 1.0;
        dVar42 = dVar42 + 1.0;
      } while (dVar41 <= (double)(int)uVar15);
    }
    iVar34 = (int)dVar40;
    if (iVar34 == -1) goto LAB_00782a88;
  }
  local_150 = getMatrix(iVar34,cols);
  if (local_150 == (DdHalfWord **)0x0) goto LAB_00782a88;
  puVar13 = (uint *)malloc((long)iVar34 << 2);
  if (puVar13 == (uint *)0x0) {
    puVar13 = (uint *)0x0;
LAB_007829e0:
    local_138 = (DdHalfWord *)0x0;
    local_148 = (DdHalfWord *)0x0;
    local_168 = (uint *)0x0;
    matrix = (DdHalfWord **)0x0;
    __ptr_00 = (void *)0x0;
LAB_00782a31:
    freeMatrix(local_150);
  }
  else {
    matrix = getMatrix(iVar34,cols);
    if (matrix == (DdHalfWord **)0x0) goto LAB_007829e0;
    __ptr = (uint *)malloc((long)iVar34 << 2);
    if (__ptr == (uint *)0x0) {
      local_148 = (DdHalfWord *)0x0;
      __ptr_00 = (void *)0x0;
      local_168 = (uint *)0x0;
LAB_00782a2c:
      local_138 = (DdHalfWord *)0x0;
      goto LAB_00782a31;
    }
    lVar18 = (long)(int)cols;
    local_148 = (DdHalfWord *)malloc(lVar18 * 4);
    local_168 = __ptr;
    if (local_148 == (DdHalfWord *)0x0) {
      local_148 = (DdHalfWord *)0x0;
LAB_00782a13:
      __ptr_00 = (void *)0x0;
      goto LAB_00782a2c;
    }
    __ptr_00 = malloc((long)iVar8);
    if (__ptr_00 == (void *)0x0) goto LAB_00782a13;
    local_138 = initSymmInfo(table,uVar36,upper_00);
    if (local_138 == (DdHalfWord *)0x0) goto LAB_00782a2c;
    iVar34 = ddCountRoots(table,uVar36,upper_00);
    if (-1 < (int)uVar9) {
      pDVar4 = *matrix;
      piVar5 = table->invperm;
      uVar23 = 0;
      do {
        DVar1 = piVar5[(long)(int)uVar36 + uVar23];
        local_148[uVar23] = DVar1;
        pDVar4[uVar23] = DVar1;
        uVar23 = uVar23 + 1;
      } while ((upper_00 + 1) - uVar36 != uVar23);
    }
    iVar33 = upper_00 + 1;
    uVar15 = (table->constants).keys;
    if (iVar33 < iVar8) {
      puVar24 = &table->subtables[iVar33].keys;
      lVar27 = 0;
      do {
        uVar15 = (uVar15 - (table->vars[table->invperm[iVar33 + lVar27]]->ref == 1)) + *puVar24;
        lVar27 = lVar27 + 1;
        puVar24 = puVar24 + 0xe;
      } while (iVar8 - iVar33 != (int)lVar27);
    }
    *__ptr = uVar15;
    local_140 = puVar13;
    if (uVar9 < 0x7fffffff) {
      local_158 = table->keys - table->isolated;
      local_154 = 1;
      iVar33 = iVar33 - (int)uVar39;
      local_a8 = lVar18 * 4;
      uVar23 = 1;
      local_b0 = -1;
      local_100 = uVar12;
      do {
        ppDVar28 = matrix;
        __ptr = local_140;
        local_a8 = local_a8 + -4;
        local_140 = local_168;
        uVar10 = (uint)uVar21;
        uVar15 = uVar10;
        if ((int)uVar10 < (int)uVar36) {
          uVar15 = uVar36;
        }
        if ((int)local_154 < 1) {
          local_154 = 0;
        }
        else {
          lVar27 = lVar18 - uVar23;
          uVar7 = (uint)lVar27;
          iVar26 = uVar7 + uVar36;
          iVar8 = uVar7 + uVar36 + 1;
          uVar21 = (ulong)local_154;
          uVar35 = 0;
          local_154 = 0;
          do {
            uVar2 = local_168[uVar35];
            uVar11 = uVar2;
            if (0 < (int)uVar36) {
              puVar13 = &table->subtables->keys;
              uVar29 = 0;
              do {
                uVar11 = (uVar11 + *puVar13) - (uint)(table->vars[table->invperm[uVar29]]->ref == 1)
                ;
                uVar29 = uVar29 + 1;
                puVar13 = puVar13 + 0xe;
              } while (uVar37 != uVar29);
            }
            pDVar4 = ppDVar28[uVar35];
            iVar20 = 0;
            iVar16 = 0;
            if (-1 < lVar27) {
              puVar13 = &table->subtables[uVar39].keys;
              lVar30 = 0;
              iVar16 = 0;
              do {
                uVar22 = 1;
                if (*puVar13 < 2) {
                  uVar22 = (uint)(1 < table->vars[pDVar4[lVar30]]->ref);
                }
                iVar16 = iVar16 + uVar22;
                lVar30 = lVar30 + 1;
                puVar13 = puVar13 + 0xe;
              } while (uVar15 + (1 - (int)uVar39) != (int)lVar30);
            }
            if (iVar8 < table->size) {
              if (iVar26 < upper_00) {
                uVar29 = (ulong)pDVar4[lVar27 + 1];
              }
              else {
                uVar29 = (ulong)table->invperm[uVar38 + 1];
              }
              iVar20 = (((table->vars[uVar29]->ref < 2) - 1) - iVar34) +
                       table->subtables[iVar8].keys;
            }
            if (iVar20 < iVar16) {
              iVar20 = iVar16;
            }
            if ((int)(iVar20 + uVar11) < local_158) {
              iVar20 = ddShuffle(table,pDVar4,uVar36,upper_00);
              matrix = ppDVar28;
              puVar13 = __ptr;
              if (iVar20 == 0) goto LAB_007832bd;
              iVar20 = table->keys - table->isolated;
              if ((iVar20 < local_158) && (local_158 = iVar20, (int)uVar36 <= upper_00)) {
                piVar5 = table->invperm;
                lVar30 = 0;
                do {
                  local_148[lVar30] = piVar5[uVar39 + lVar30];
                  lVar30 = lVar30 + 1;
                } while (iVar33 != (int)lVar30);
              }
              lVar30 = (long)(int)local_100;
              if (-1 < lVar27) {
                do {
                  piVar5 = table->invperm;
                  iVar16 = (uVar36 - 1) + (int)lVar30;
                  iVar20 = local_158;
                  if ((table->subtables[iVar16].keys != 1) ||
                     (table->vars[piVar5[iVar16]]->ref != 1)) {
                    DVar1 = table->vars[piVar5[iVar26]]->ref;
                    uVar11 = table->subtables[iVar26].keys;
                    if ((int)uVar36 <= upper_00) {
                      lVar31 = 0;
                      do {
                        *(undefined1 *)((long)__ptr_00 + (long)piVar5[uVar39 + lVar31]) = 0;
                        lVar31 = lVar31 + 1;
                      } while (iVar33 != (int)lVar31);
                    }
                    lVar31 = local_b0;
                    if (lVar27 <= (long)uVar12) {
                      do {
                        *(undefined1 *)((long)__ptr_00 + (ulong)pDVar4[lVar18 + lVar31]) = 1;
                        lVar31 = lVar31 + 1;
                      } while ((int)lVar31 != 0);
                    }
                    uVar11 = (uVar11 + uVar2) - (uint)(DVar1 == 1);
                    uVar29 = (ulong)local_154;
                    uVar32 = 0;
                    if ((int)local_154 < 1) {
LAB_007830d2:
                      if ((uint)uVar32 == local_154) {
                        iVar16 = 1;
                        goto LAB_007830f3;
                      }
                      uVar29 = uVar32 & 0xffffffff;
                      iVar16 = 0;
                      if ((int)uVar11 < (int)__ptr[uVar29]) goto LAB_007830f3;
                    }
                    else {
                      do {
                        uVar22 = uVar7;
                        if (lVar27 <= (long)uVar12) {
                          lVar31 = 0;
                          while (*(char *)((long)__ptr_00 +
                                          (ulong)*(uint *)((long)local_150[uVar32] +
                                                          lVar31 * 4 + local_a8)) != '\0') {
                            lVar31 = lVar31 + 1;
                            if ((int)uVar23 == (int)lVar31) goto LAB_007830d2;
                          }
                          uVar22 = (int)lVar31 - iVar14;
                        }
                        if (uVar22 == cols) goto LAB_007830d2;
                        uVar32 = uVar32 + 1;
                      } while (uVar32 != uVar29);
                      iVar16 = 1;
LAB_007830f3:
                      pDVar19 = local_150[uVar29];
                      uVar32 = 0;
                      do {
                        pDVar19[uVar32] = pDVar4[uVar32];
                        uVar32 = uVar32 + 1;
                      } while (cols != uVar32);
                      __ptr[uVar29] = uVar11;
                      local_154 = local_154 + iVar16;
                    }
                    if (lVar30 == 0) break;
                    DVar1 = pDVar4[lVar30 + -1];
                    for (DVar17 = local_138[(int)DVar1]; DVar17 != DVar1;
                        DVar17 = local_138[(int)DVar17]) {
                      if (((int)DVar1 < (int)DVar17) && (table->perm[(int)DVar17] <= lVar27))
                      goto LAB_0078324d;
                    }
                    if (lVar30 <= lVar27) {
                      pDVar19 = pDVar4 + lVar30;
                      lVar31 = lVar30 << 0x20;
                      do {
                        pDVar19[-1] = *pDVar19;
                        lVar25 = lVar31 >> 0x20;
                        pDVar19 = pDVar19 + 1;
                        lVar31 = lVar31 + 0x100000000;
                      } while (lVar25 < lVar27);
                    }
                    pDVar4[lVar27] = DVar1;
                    iVar16 = ddShuffle(table,pDVar4,uVar36,upper_00);
                    if (iVar16 == 0) goto LAB_007832bd;
                    iVar16 = table->keys - table->isolated;
                    if (iVar16 < local_158) {
                      iVar20 = iVar16;
                    }
                    if (((int)uVar36 <= upper_00) && (iVar16 < local_158)) {
                      piVar5 = table->invperm;
                      lVar31 = 0;
                      do {
                        local_148[lVar31] = piVar5[uVar39 + lVar31];
                        lVar31 = lVar31 + 1;
                        iVar20 = iVar16;
                      } while (iVar33 != (int)lVar31);
                    }
                  }
LAB_0078324d:
                  local_158 = iVar20;
                  bVar6 = 0 < lVar30;
                  lVar30 = lVar30 + -1;
                } while (bVar6);
              }
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 != uVar21);
        }
        uVar23 = uVar23 + 1;
        local_100 = (ulong)((int)local_100 - 1);
        uVar21 = (ulong)(uVar10 - 1);
        local_b0 = local_b0 + -1;
        iVar14 = iVar14 + 1;
        local_168 = __ptr;
        matrix = local_150;
        local_150 = ppDVar28;
      } while (uVar23 != uVar9 + 2);
    }
    iVar14 = ddShuffle(table,local_148,uVar36,upper_00);
    puVar13 = local_140;
    local_168 = __ptr;
    if (iVar14 != 0) {
      freeMatrix(local_150);
      freeMatrix(matrix);
      free(local_148);
      free(__ptr);
      free(local_140);
      free(local_138);
      free(__ptr_00);
      return 1;
    }
LAB_007832bd:
    if (local_150 != (DdHalfWord **)0x0) goto LAB_00782a31;
  }
  if (matrix != (DdHalfWord **)0x0) {
    freeMatrix(matrix);
  }
  if (local_148 != (DdHalfWord *)0x0) {
    free(local_148);
  }
  if (local_168 != (uint *)0x0) {
    free(local_168);
  }
  if (puVar13 != (uint *)0x0) {
    free(puVar13);
  }
  if (local_138 != (DdHalfWord *)0x0) {
    free(local_138);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
LAB_00782a88:
  table->errorCode = CUDD_MEMORY_OUT;
  return 0;
}

Assistant:

int
cuddExact(
  DdManager * table,
  int  lower,
  int  upper)
{
    int k, i, j;
    int maxBinomial, oldSubsets, newSubsets;
    int subsetCost;
    int size;                   /* number of variables to be reordered */
    int unused, nvars, level, result;
    int upperBound, lowerBound, cost;
    int roots;
    char *mask = NULL;
    DdHalfWord  *symmInfo = NULL;
    DdHalfWord **newOrder = NULL;
    DdHalfWord **oldOrder = NULL;
    int *newCost = NULL;
    int *oldCost = NULL;
    DdHalfWord **tmpOrder;
    int *tmpCost;
    DdHalfWord *bestOrder = NULL;
    DdHalfWord *order;
#ifdef DD_STATS
    int  ddTotalSubsets;
#endif

    /* Restrict the range to be reordered by excluding unused variables
    ** at the two ends. */
    while (table->subtables[lower].keys == 1 &&
           table->vars[table->invperm[lower]]->ref == 1 &&
           lower < upper)
        lower++;
    while (table->subtables[upper].keys == 1 &&
           table->vars[table->invperm[upper]]->ref == 1 &&
           lower < upper)
        upper--;
    if (lower == upper) return(1); /* trivial problem */

    /* Apply symmetric sifting to get a good upper bound and to extract
    ** symmetry information. */
    result = cuddSymmSiftingConv(table,lower,upper);
    if (result == 0) goto cuddExactOutOfMem;

#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
    ddTotalShuffles = 0;
    ddTotalSubsets = 0;
#endif

    /* Initialization. */
    nvars = table->size;
    size = upper - lower + 1;
    /* Count unused variable among those to be reordered.  This is only
    ** used to compute maxBinomial. */
    unused = 0;
    for (i = lower + 1; i < upper; i++) {
        if (table->subtables[i].keys == 1 &&
            table->vars[table->invperm[i]]->ref == 1)
            unused++;
    }

    /* Find the maximum number of subsets we may have to store. */
    maxBinomial = getMaxBinomial(size - unused);
    if (maxBinomial == -1) goto cuddExactOutOfMem;

    newOrder = getMatrix(maxBinomial, size);
    if (newOrder == NULL) goto cuddExactOutOfMem;

    newCost = ABC_ALLOC(int, maxBinomial);
    if (newCost == NULL) goto cuddExactOutOfMem;

    oldOrder = getMatrix(maxBinomial, size);
    if (oldOrder == NULL) goto cuddExactOutOfMem;

    oldCost = ABC_ALLOC(int, maxBinomial);
    if (oldCost == NULL) goto cuddExactOutOfMem;

    bestOrder = ABC_ALLOC(DdHalfWord, size);
    if (bestOrder == NULL) goto cuddExactOutOfMem;

    mask = ABC_ALLOC(char, nvars);
    if (mask == NULL) goto cuddExactOutOfMem;

    symmInfo = initSymmInfo(table, lower, upper);
    if (symmInfo == NULL) goto cuddExactOutOfMem;

    roots = ddCountRoots(table, lower, upper);

    /* Initialize the old order matrix for the empty subset and the best
    ** order to the current order. The cost for the empty subset includes
    ** the cost of the levels between upper and the constants. These levels
    ** are not going to change. Hence, we count them only once.
    */
    oldSubsets = 1;
    for (i = 0; i < size; i++) {
        oldOrder[0][i] = bestOrder[i] = (DdHalfWord) table->invperm[i+lower];
    }
    subsetCost = table->constants.keys;
    for (i = upper + 1; i < nvars; i++)
        subsetCost += getLevelKeys(table,i);
    oldCost[0] = subsetCost;
    /* The upper bound is initialized to the current size of the BDDs. */
    upperBound = table->keys - table->isolated;

    /* Now consider subsets of increasing size. */
    for (k = 1; k <= size; k++) {
#ifdef DD_STATS
        (void) fprintf(table->out,"Processing subsets of size %d\n", k);
        fflush(table->out);
#endif
        newSubsets = 0;
        level = size - k;               /* offset of first bottom variable */

        for (i = 0; i < oldSubsets; i++) { /* for each subset of size k-1 */
            order = oldOrder[i];
            cost = oldCost[i];
            lowerBound = computeLB(table, order, roots, cost, lower, upper,
                                   level);
            if (lowerBound >= upperBound)
                continue;
            /* Impose new order. */
            result = ddShuffle(table, order, lower, upper);
            if (result == 0) goto cuddExactOutOfMem;
            upperBound = updateUB(table,upperBound,bestOrder,lower,upper);
            /* For each top bottom variable. */
            for (j = level; j >= 0; j--) {
                /* Skip unused variables. */
                if (table->subtables[j+lower-1].keys == 1 &&
                    table->vars[table->invperm[j+lower-1]]->ref == 1) continue;
                /* Find cost under this order. */
                subsetCost = cost + getLevelKeys(table, lower + level);
                newSubsets = updateEntry(table, order, level, subsetCost,
                                         newOrder, newCost, newSubsets, mask,
                                         lower, upper);
                if (j == 0)
                    break;
                if (checkSymmInfo(table, symmInfo, order[j-1], level) == 0)
                    continue;
                pushDown(order,j-1,level);
                /* Impose new order. */
                result = ddShuffle(table, order, lower, upper);
                if (result == 0) goto cuddExactOutOfMem;
                upperBound = updateUB(table,upperBound,bestOrder,lower,upper);
            } /* for each bottom variable */
        } /* for each subset of size k */

        /* New orders become old orders in preparation for next iteration. */
        tmpOrder = oldOrder; tmpCost = oldCost;
        oldOrder = newOrder; oldCost = newCost;
        newOrder = tmpOrder; newCost = tmpCost;
#ifdef DD_STATS
        ddTotalSubsets += newSubsets;
#endif
        oldSubsets = newSubsets;
    }
    result = ddShuffle(table, bestOrder, lower, upper);
    if (result == 0) goto cuddExactOutOfMem;
#ifdef DD_STATS
#ifdef DD_VERBOSE
    (void) fprintf(table->out,"\n");
#endif
    (void) fprintf(table->out,"#:S_EXACT   %8d: total subsets\n",
                   ddTotalSubsets);
    (void) fprintf(table->out,"#:H_EXACT   %8d: total shuffles",
                   ddTotalShuffles);
#endif

    freeMatrix(newOrder);
    freeMatrix(oldOrder);
    ABC_FREE(bestOrder);
    ABC_FREE(oldCost);
    ABC_FREE(newCost);
    ABC_FREE(symmInfo);
    ABC_FREE(mask);
    return(1);

cuddExactOutOfMem:

    if (newOrder != NULL) freeMatrix(newOrder);
    if (oldOrder != NULL) freeMatrix(oldOrder);
    if (bestOrder != NULL) ABC_FREE(bestOrder);
    if (oldCost != NULL) ABC_FREE(oldCost);
    if (newCost != NULL) ABC_FREE(newCost);
    if (symmInfo != NULL) ABC_FREE(symmInfo);
    if (mask != NULL) ABC_FREE(mask);
    table->errorCode = CUDD_MEMORY_OUT;
    return(0);

}